

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_handle.cpp
# Opt level: O2

bool __thiscall miniros::NodeHandle::searchParam(NodeHandle *this,string *key,string *result_out)

{
  bool bVar1;
  const_iterator cVar2;
  allocator<char> local_89;
  undefined1 local_88 [16];
  string remapped;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&remapped,(string *)key);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->unresolved_remappings_)._M_t,key);
  if ((_Rb_tree_header *)cVar2._M_node !=
      &(this->unresolved_remappings_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_assign((string *)&remapped);
  }
  getMasterLink((NodeHandle *)local_88);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"",&local_89);
  resolveName(&local_38,this,&local_58,true);
  bVar1 = MasterLink::search((MasterLink *)local_88._0_8_,&local_38,&remapped,result_out);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__cxx11::string::~string((string *)&remapped);
  return bVar1;
}

Assistant:

bool NodeHandle::searchParam(const std::string& key, std::string& result_out) const
{
  // searchParam needs a separate form of remapping -- remapping on the unresolved name, rather than the
  // resolved one.

  std::string remapped = key;
  M_string::const_iterator it = unresolved_remappings_.find(key);
  // First try our local remappings
  if (it != unresolved_remappings_.end())
  {
    remapped = it->second;
  }

  return getMasterLink()->search(resolveName(""), remapped, result_out);
}